

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  char cVar13;
  undefined4 uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong unaff_RBX;
  ulong uVar18;
  ulong uVar19;
  NodeRef *pNVar20;
  NodeRef *pNVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  vint4 ai_1;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 ai;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 ai_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_7;
  undefined1 auVar38 [16];
  vint4 bi_4;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar44;
  float fVar45;
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar52;
  float fVar53;
  float fVar56;
  float fVar57;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 bi;
  vint4 bi_2;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar62._4_4_ = fVar1;
  auVar62._0_4_ = fVar1;
  auVar62._8_4_ = fVar1;
  auVar62._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar63._4_4_ = fVar2;
  auVar63._0_4_ = fVar2;
  auVar63._8_4_ = fVar2;
  auVar63._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar59._4_4_ = fVar3;
  auVar59._0_4_ = fVar3;
  auVar59._8_4_ = fVar3;
  auVar59._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar40._4_4_ = iVar10;
  auVar40._0_4_ = iVar10;
  auVar40._8_4_ = iVar10;
  auVar40._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar41._4_4_ = iVar10;
  auVar41._0_4_ = iVar10;
  auVar41._8_4_ = iVar10;
  auVar41._12_4_ = iVar10;
  pNVar21 = stack + 1;
  do {
    pNVar20 = pNVar21;
    if (pNVar20 == stack) break;
    pNVar21 = pNVar20 + -1;
    sVar23 = pNVar20[-1].ptr;
    do {
      if ((sVar23 & 0xf) == 0) {
        auVar11 = vsubps_avx(*(undefined1 (*) [16])(sVar23 + 0x20 + uVar24),auVar62);
        auVar26._0_4_ = fVar7 * auVar11._0_4_;
        auVar26._4_4_ = fVar7 * auVar11._4_4_;
        auVar26._8_4_ = fVar7 * auVar11._8_4_;
        auVar26._12_4_ = fVar7 * auVar11._12_4_;
        auVar11 = vsubps_avx(*(undefined1 (*) [16])(sVar23 + 0x20 + uVar25),auVar63);
        auVar30._0_4_ = fVar8 * auVar11._0_4_;
        auVar30._4_4_ = fVar8 * auVar11._4_4_;
        auVar30._8_4_ = fVar8 * auVar11._8_4_;
        auVar30._12_4_ = fVar8 * auVar11._12_4_;
        auVar11 = vpmaxsd_avx(auVar26,auVar30);
        auVar54 = vsubps_avx(*(undefined1 (*) [16])(sVar23 + 0x20 + uVar18),auVar59);
        auVar31._0_4_ = fVar9 * auVar54._0_4_;
        auVar31._4_4_ = fVar9 * auVar54._4_4_;
        auVar31._8_4_ = fVar9 * auVar54._8_4_;
        auVar31._12_4_ = fVar9 * auVar54._12_4_;
        auVar54 = vsubps_avx(*(undefined1 (*) [16])(sVar23 + 0x20 + (uVar24 ^ 0x10)),auVar62);
        auVar33._0_4_ = fVar7 * auVar54._0_4_;
        auVar33._4_4_ = fVar7 * auVar54._4_4_;
        auVar33._8_4_ = fVar7 * auVar54._8_4_;
        auVar33._12_4_ = fVar7 * auVar54._12_4_;
        auVar54 = vsubps_avx(*(undefined1 (*) [16])(sVar23 + 0x20 + (uVar25 ^ 0x10)),auVar63);
        auVar35._0_4_ = fVar8 * auVar54._0_4_;
        auVar35._4_4_ = fVar8 * auVar54._4_4_;
        auVar35._8_4_ = fVar8 * auVar54._8_4_;
        auVar35._12_4_ = fVar8 * auVar54._12_4_;
        auVar29 = vpminsd_avx(auVar33,auVar35);
        auVar54 = vsubps_avx(*(undefined1 (*) [16])(sVar23 + 0x20 + (uVar18 ^ 0x10)),auVar59);
        auVar36._0_4_ = fVar9 * auVar54._0_4_;
        auVar36._4_4_ = fVar9 * auVar54._4_4_;
        auVar36._8_4_ = fVar9 * auVar54._8_4_;
        auVar36._12_4_ = fVar9 * auVar54._12_4_;
        auVar54 = vpmaxsd_avx(auVar31,auVar40);
        auVar11 = vpmaxsd_avx(auVar11,auVar54);
        auVar54 = vpminsd_avx(auVar36,auVar41);
        auVar54 = vpminsd_avx(auVar29,auVar54);
        auVar11 = vpcmpgtd_avx(auVar11,auVar54);
        uVar14 = vmovmskps_avx(auVar11);
        unaff_RBX = (ulong)(byte)((byte)uVar14 ^ 0xf);
LAB_00370218:
        bVar12 = true;
      }
      else {
        if ((int)(sVar23 & 0xf) == 2) {
          uVar22 = sVar23 & 0xfffffffffffffff0;
          auVar54._0_4_ =
               fVar6 * *(float *)(uVar22 + 0x80) + fVar5 * *(float *)(uVar22 + 0x50) +
               fVar4 * *(float *)(uVar22 + 0x20);
          auVar54._4_4_ =
               fVar6 * *(float *)(uVar22 + 0x84) + fVar5 * *(float *)(uVar22 + 0x54) +
               fVar4 * *(float *)(uVar22 + 0x24);
          auVar54._8_4_ =
               fVar6 * *(float *)(uVar22 + 0x88) + fVar5 * *(float *)(uVar22 + 0x58) +
               fVar4 * *(float *)(uVar22 + 0x28);
          auVar54._12_4_ =
               fVar6 * *(float *)(uVar22 + 0x8c) + fVar5 * *(float *)(uVar22 + 0x5c) +
               fVar4 * *(float *)(uVar22 + 0x2c);
          auVar43._0_4_ =
               fVar6 * *(float *)(uVar22 + 0x90) + fVar5 * *(float *)(uVar22 + 0x60) +
               fVar4 * *(float *)(uVar22 + 0x30);
          auVar43._4_4_ =
               fVar6 * *(float *)(uVar22 + 0x94) + fVar5 * *(float *)(uVar22 + 100) +
               fVar4 * *(float *)(uVar22 + 0x34);
          auVar43._8_4_ =
               fVar6 * *(float *)(uVar22 + 0x98) + fVar5 * *(float *)(uVar22 + 0x68) +
               fVar4 * *(float *)(uVar22 + 0x38);
          auVar43._12_4_ =
               fVar6 * *(float *)(uVar22 + 0x9c) + fVar5 * *(float *)(uVar22 + 0x6c) +
               fVar4 * *(float *)(uVar22 + 0x3c);
          auVar48._0_4_ =
               fVar6 * *(float *)(uVar22 + 0xa0) + fVar5 * *(float *)(uVar22 + 0x70) +
               fVar4 * *(float *)(uVar22 + 0x40);
          auVar48._4_4_ =
               fVar6 * *(float *)(uVar22 + 0xa4) + fVar5 * *(float *)(uVar22 + 0x74) +
               fVar4 * *(float *)(uVar22 + 0x44);
          auVar48._8_4_ =
               fVar6 * *(float *)(uVar22 + 0xa8) + fVar5 * *(float *)(uVar22 + 0x78) +
               fVar4 * *(float *)(uVar22 + 0x48);
          auVar48._12_4_ =
               fVar6 * *(float *)(uVar22 + 0xac) + fVar5 * *(float *)(uVar22 + 0x7c) +
               fVar4 * *(float *)(uVar22 + 0x4c);
          auVar61._8_4_ = 0x7fffffff;
          auVar61._0_8_ = 0x7fffffff7fffffff;
          auVar61._12_4_ = 0x7fffffff;
          auVar11 = vandps_avx(auVar54,auVar61);
          auVar27._8_4_ = 0x219392ef;
          auVar27._0_8_ = 0x219392ef219392ef;
          auVar27._12_4_ = 0x219392ef;
          auVar11 = vcmpps_avx(auVar11,auVar27,1);
          auVar54 = vblendvps_avx(auVar54,auVar27,auVar11);
          auVar11 = vandps_avx(auVar43,auVar61);
          auVar11 = vcmpps_avx(auVar11,auVar27,1);
          auVar29 = vblendvps_avx(auVar43,auVar27,auVar11);
          auVar11 = vandps_avx(auVar48,auVar61);
          auVar11 = vcmpps_avx(auVar11,auVar27,1);
          auVar11 = vblendvps_avx(auVar48,auVar27,auVar11);
          auVar27 = vrcpps_avx(auVar54);
          fVar42 = auVar27._0_4_;
          auVar49._0_4_ = fVar42 * auVar54._0_4_;
          fVar44 = auVar27._4_4_;
          auVar49._4_4_ = fVar44 * auVar54._4_4_;
          fVar45 = auVar27._8_4_;
          auVar49._8_4_ = fVar45 * auVar54._8_4_;
          fVar46 = auVar27._12_4_;
          auVar49._12_4_ = fVar46 * auVar54._12_4_;
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar54 = vsubps_avx(auVar28,auVar49);
          fVar42 = fVar42 + fVar42 * auVar54._0_4_;
          fVar44 = fVar44 + fVar44 * auVar54._4_4_;
          fVar45 = fVar45 + fVar45 * auVar54._8_4_;
          fVar46 = fVar46 + fVar46 * auVar54._12_4_;
          auVar54 = vrcpps_avx(auVar29);
          fVar47 = auVar54._0_4_;
          auVar55._0_4_ = fVar47 * auVar29._0_4_;
          fVar50 = auVar54._4_4_;
          auVar55._4_4_ = fVar50 * auVar29._4_4_;
          fVar51 = auVar54._8_4_;
          auVar55._8_4_ = fVar51 * auVar29._8_4_;
          fVar52 = auVar54._12_4_;
          auVar55._12_4_ = fVar52 * auVar29._12_4_;
          auVar54 = vsubps_avx(auVar28,auVar55);
          fVar47 = fVar47 + fVar47 * auVar54._0_4_;
          fVar50 = fVar50 + fVar50 * auVar54._4_4_;
          fVar51 = fVar51 + fVar51 * auVar54._8_4_;
          fVar52 = fVar52 + fVar52 * auVar54._12_4_;
          auVar54 = vrcpps_avx(auVar11);
          fVar53 = auVar54._0_4_;
          auVar60._0_4_ = fVar53 * auVar11._0_4_;
          fVar56 = auVar54._4_4_;
          auVar60._4_4_ = fVar56 * auVar11._4_4_;
          fVar57 = auVar54._8_4_;
          auVar60._8_4_ = fVar57 * auVar11._8_4_;
          fVar58 = auVar54._12_4_;
          auVar60._12_4_ = fVar58 * auVar11._12_4_;
          auVar11 = vsubps_avx(auVar28,auVar60);
          fVar53 = fVar53 + fVar53 * auVar11._0_4_;
          fVar56 = fVar56 + fVar56 * auVar11._4_4_;
          fVar57 = fVar57 + fVar57 * auVar11._8_4_;
          fVar58 = fVar58 + fVar58 * auVar11._12_4_;
          auVar34._0_4_ =
               (fVar1 * *(float *)(uVar22 + 0x20) +
               fVar2 * *(float *)(uVar22 + 0x50) +
               fVar3 * *(float *)(uVar22 + 0x80) + *(float *)(uVar22 + 0xb0)) * -fVar42;
          auVar34._4_4_ =
               (fVar1 * *(float *)(uVar22 + 0x24) +
               fVar2 * *(float *)(uVar22 + 0x54) +
               fVar3 * *(float *)(uVar22 + 0x84) + *(float *)(uVar22 + 0xb4)) * -fVar44;
          auVar34._8_4_ =
               (fVar1 * *(float *)(uVar22 + 0x28) +
               fVar2 * *(float *)(uVar22 + 0x58) +
               fVar3 * *(float *)(uVar22 + 0x88) + *(float *)(uVar22 + 0xb8)) * -fVar45;
          auVar34._12_4_ =
               (fVar1 * *(float *)(uVar22 + 0x2c) +
               fVar2 * *(float *)(uVar22 + 0x5c) +
               fVar3 * *(float *)(uVar22 + 0x8c) + *(float *)(uVar22 + 0xbc)) * -fVar46;
          auVar32._0_4_ =
               (fVar1 * *(float *)(uVar22 + 0x30) +
               fVar2 * *(float *)(uVar22 + 0x60) +
               fVar3 * *(float *)(uVar22 + 0x90) + *(float *)(uVar22 + 0xc0)) * -fVar47;
          auVar32._4_4_ =
               (fVar1 * *(float *)(uVar22 + 0x34) +
               fVar2 * *(float *)(uVar22 + 100) +
               fVar3 * *(float *)(uVar22 + 0x94) + *(float *)(uVar22 + 0xc4)) * -fVar50;
          auVar32._8_4_ =
               (fVar1 * *(float *)(uVar22 + 0x38) +
               fVar2 * *(float *)(uVar22 + 0x68) +
               fVar3 * *(float *)(uVar22 + 0x98) + *(float *)(uVar22 + 200)) * -fVar51;
          auVar32._12_4_ =
               (fVar1 * *(float *)(uVar22 + 0x3c) +
               fVar2 * *(float *)(uVar22 + 0x6c) +
               fVar3 * *(float *)(uVar22 + 0x9c) + *(float *)(uVar22 + 0xcc)) * -fVar52;
          auVar29._0_4_ =
               (fVar1 * *(float *)(uVar22 + 0x40) +
               fVar2 * *(float *)(uVar22 + 0x70) +
               fVar3 * *(float *)(uVar22 + 0xa0) + *(float *)(uVar22 + 0xd0)) * -fVar53;
          auVar29._4_4_ =
               (fVar1 * *(float *)(uVar22 + 0x44) +
               fVar2 * *(float *)(uVar22 + 0x74) +
               fVar3 * *(float *)(uVar22 + 0xa4) + *(float *)(uVar22 + 0xd4)) * -fVar56;
          auVar29._8_4_ =
               (fVar1 * *(float *)(uVar22 + 0x48) +
               fVar2 * *(float *)(uVar22 + 0x78) +
               fVar3 * *(float *)(uVar22 + 0xa8) + *(float *)(uVar22 + 0xd8)) * -fVar57;
          auVar29._12_4_ =
               (fVar1 * *(float *)(uVar22 + 0x4c) +
               fVar2 * *(float *)(uVar22 + 0x7c) +
               fVar3 * *(float *)(uVar22 + 0xac) + *(float *)(uVar22 + 0xdc)) * -fVar58;
          auVar37._0_4_ = fVar42 + auVar34._0_4_;
          auVar37._4_4_ = fVar44 + auVar34._4_4_;
          auVar37._8_4_ = fVar45 + auVar34._8_4_;
          auVar37._12_4_ = fVar46 + auVar34._12_4_;
          auVar38._0_4_ = fVar47 + auVar32._0_4_;
          auVar38._4_4_ = fVar50 + auVar32._4_4_;
          auVar38._8_4_ = fVar51 + auVar32._8_4_;
          auVar38._12_4_ = fVar52 + auVar32._12_4_;
          auVar39._0_4_ = fVar53 + auVar29._0_4_;
          auVar39._4_4_ = fVar56 + auVar29._4_4_;
          auVar39._8_4_ = fVar57 + auVar29._8_4_;
          auVar39._12_4_ = fVar58 + auVar29._12_4_;
          auVar11 = vpminsd_avx(auVar32,auVar38);
          auVar54 = vpminsd_avx(auVar29,auVar39);
          auVar11 = vmaxps_avx(auVar11,auVar54);
          auVar28 = vpminsd_avx(auVar34,auVar37);
          auVar27 = vpmaxsd_avx(auVar34,auVar37);
          auVar54 = vpmaxsd_avx(auVar32,auVar38);
          auVar29 = vpmaxsd_avx(auVar29,auVar39);
          auVar29 = vminps_avx(auVar54,auVar29);
          auVar54 = vmaxps_avx(auVar40,auVar28);
          auVar11 = vmaxps_avx(auVar54,auVar11);
          auVar54 = vminps_avx(auVar41,auVar27);
          auVar54 = vminps_avx(auVar54,auVar29);
          auVar11 = vcmpps_avx(auVar11,auVar54,2);
          uVar14 = vmovmskps_avx(auVar11);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar14);
          goto LAB_00370218;
        }
        bVar12 = false;
      }
      if (bVar12) {
        if (unaff_RBX == 0) {
          uVar16 = 4;
        }
        else {
          uVar22 = sVar23 & 0xfffffffffffffff0;
          lVar17 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
            }
          }
          uVar16 = 0;
          sVar23 = *(size_t *)(uVar22 + lVar17 * 8);
          uVar19 = unaff_RBX - 1 & unaff_RBX;
          if (uVar19 != 0) {
            pNVar21->ptr = sVar23;
            lVar17 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            uVar15 = uVar19 - 1;
            while( true ) {
              pNVar21 = pNVar21 + 1;
              sVar23 = *(size_t *)(uVar22 + lVar17 * 8);
              uVar15 = uVar15 & uVar19;
              if (uVar15 == 0) break;
              pNVar21->ptr = sVar23;
              lVar17 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              uVar19 = uVar15 - 1;
            }
          }
        }
      }
      else {
        uVar16 = 6;
      }
    } while (uVar16 == 0);
    if (uVar16 == 6) {
      cVar13 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar23 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar16 = 0;
      if (cVar13 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar16 = 1;
      }
    }
  } while ((uVar16 & 3) == 0);
  return pNVar20 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }